

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O2

void Bac_NtkCreateOrConnectFanin(Abc_Obj_t *pFanin,Bac_Ntk_t *p,int iTerm)

{
  int iVar1;
  ulong uVar2;
  Bac_Man_t *pBVar3;
  
  if (pFanin == (Abc_Obj_t *)0x0) {
    pBVar3 = p->pDesign;
    uVar2 = 0;
LAB_006f33b6:
    iVar1 = pBVar3->ElemGates[uVar2];
  }
  else {
    iVar1 = Abc_NodeIsSeriousGate(pFanin);
    if (iVar1 != 0) {
      iVar1 = (pFanin->field_6).iTemp;
      goto LAB_006f340b;
    }
    if ((*(uint *)&pFanin->field_0x14 & 0xf) != 2) {
      iVar1 = Abc_ObjIsBarBuf(pFanin);
      if (iVar1 == 0) {
        iVar1 = Abc_NodeIsConst0(pFanin);
        if (iVar1 == 0) {
          iVar1 = Abc_NodeIsConst1(pFanin);
          if (iVar1 == 0) {
            __assert_fail("!pFanin || Abc_NodeIsConst0(pFanin) || Abc_NodeIsConst1(pFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                          ,0x1e4,"void Bac_NtkCreateOrConnectFanin(Abc_Obj_t *, Bac_Ntk_t *, int)");
          }
        }
        pBVar3 = p->pDesign;
        iVar1 = Abc_NodeIsConst1(pFanin);
        uVar2 = (ulong)(iVar1 != 0);
        goto LAB_006f33b6;
      }
    }
    Bac_ObjAlloc(p,BAC_OBJ_BI,(pFanin->field_6).iTemp);
    iVar1 = p->pDesign->ElemGates[2];
  }
  Bac_ObjAlloc(p,BAC_BOX_GATE,iVar1);
  iVar1 = Bac_ObjAlloc(p,BAC_OBJ_BO,-1);
LAB_006f340b:
  Bac_ObjSetFanin(p,iTerm,iVar1);
  return;
}

Assistant:

void Bac_NtkCreateOrConnectFanin( Abc_Obj_t * pFanin, Bac_Ntk_t * p, int iTerm )
{
    int iObj;
    if ( pFanin && Abc_NodeIsSeriousGate(pFanin) )//&& Bac_ObjName(p, pFanin->iTemp) == -1 ) // gate without name
    {
        iObj = pFanin->iTemp;
    }
    else if ( pFanin && (Abc_ObjIsPi(pFanin) || Abc_ObjIsBarBuf(pFanin) || Abc_NodeIsSeriousGate(pFanin)) ) // PI/BO or gate with name
    {
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BI, pFanin->iTemp );
        Bac_ObjAlloc( p, BAC_BOX_GATE, p->pDesign->ElemGates[2] ); // buffer
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BO, -1 );
    }
    else
    {
        assert( !pFanin || Abc_NodeIsConst0(pFanin) || Abc_NodeIsConst1(pFanin) );
        Bac_ObjAlloc( p, BAC_BOX_GATE, p->pDesign->ElemGates[(pFanin && Abc_NodeIsConst1(pFanin))] ); // const 0/1
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BO, -1 );
    }
    Bac_ObjSetFanin( p, iTerm, iObj );
}